

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::ToTypeSpec(GlobOpt *this,BVSparse<Memory::JitArenaAllocator> *bv,BasicBlock *block,
                   IRType toType,BailOutKind bailOutKind,bool lossy,Instr *insertBeforeInstr)

{
  code *pcVar1;
  BOOLEAN BVar2;
  bool bVar3;
  SymID id_00;
  BOOL BVar4;
  undefined4 *puVar5;
  RegOpnd *opnd;
  RegOpnd *newOpnd;
  StackSym *pSStack_58;
  IRType fromType;
  StackSym *stackSym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex id;
  bool lossy_local;
  BailOutKind bailOutKind_local;
  IRType toType_local;
  BasicBlock *block_local;
  BVSparse<Memory::JitArenaAllocator> *bv_local;
  GlobOpt *this_local;
  
  __startIndex = bv->head;
  while( true ) {
    if (__startIndex == (Type_conflict)0x0) {
      return;
    }
    _unit.word._0_4_ = __startIndex->startIndex;
    stackSym = (StackSym *)(__startIndex->data).word;
    _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
    while (_unit.word._4_4_ != 0xffffffff) {
      id_00 = (Type)_unit.word + _unit.word._4_4_;
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&stackSym,_unit.word._4_4_);
      pSStack_58 = SymTable::FindStackSym(this->func->m_symTable,id_00);
      newOpnd._7_1_ = TyIllegal;
      if (((block->globOptData).argObjSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
         (BVar4 = GlobOptBlockData::IsArgumentsSymID(&block->globOptData,id_00), BVar4 != 0)) {
        CannotAllocateArgumentsObjectOnStack(this,(Func *)0x0);
      }
      BVar2 = BVSparse<Memory::JitArenaAllocator>::Test((block->globOptData).liveVarSyms,id_00);
      if (BVar2 == '\0') {
        BVar2 = BVSparse<Memory::JitArenaAllocator>::Test((block->globOptData).liveInt32Syms,id_00);
        if ((BVar2 == '\0') ||
           (BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                              ((block->globOptData).liveLossyInt32Syms,id_00), BVar2 != '\0')) {
          BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((block->globOptData).liveFloat64Syms,id_00);
          if (BVar2 == '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3a2,"((0))","UNREACHED");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          else {
            newOpnd._7_1_ = TyFloat64;
            pSStack_58 = StackSym::GetFloat64EquivSym(pSStack_58,this->func);
          }
        }
        else {
          newOpnd._7_1_ = TyInt32;
          pSStack_58 = StackSym::GetInt32EquivSym(pSStack_58,this->func);
        }
      }
      else {
        newOpnd._7_1_ = TyVar;
      }
      opnd = IR::RegOpnd::New(pSStack_58,newOpnd._7_1_,this->func);
      ToTypeSpecUse(this,(Instr *)0x0,&opnd->super_Opnd,block,(Value *)0x0,(IndirOpnd *)0x0,toType,
                    bailOutKind,lossy,insertBeforeInstr);
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
    }
    if (__startIndex == (Type_conflict)0x0) break;
    __startIndex = __startIndex->next;
  }
  return;
}

Assistant:

void
GlobOpt::ToTypeSpec(BVSparse<JitArenaAllocator> *bv, BasicBlock *block, IRType toType, IR::BailOutKind bailOutKind, bool lossy, IR::Instr *insertBeforeInstr)
{
    FOREACH_BITSET_IN_SPARSEBV(id, bv)
    {
        StackSym *stackSym = this->func->m_symTable->FindStackSym(id);
        IRType fromType = TyIllegal;

        // Win8 bug: 757126. If we are trying to type specialize the arguments object,
        // let's make sure stack args optimization is not enabled. This is a problem, particularly,
        // if the instruction comes from an unreachable block. In other cases, the pass on the
        // instruction itself should disable arguments object optimization.
        if(block->globOptData.argObjSyms && block->globOptData.IsArgumentsSymID(id))
        {
            CannotAllocateArgumentsObjectOnStack(nullptr);
        }

        if (block->globOptData.liveVarSyms->Test(id))
        {
            fromType = TyVar;
        }
        else if (block->globOptData.liveInt32Syms->Test(id) && !block->globOptData.liveLossyInt32Syms->Test(id))
        {
            fromType = TyInt32;
            stackSym = stackSym->GetInt32EquivSym(this->func);
        }
        else if (block->globOptData.liveFloat64Syms->Test(id))
        {

            fromType = TyFloat64;
            stackSym = stackSym->GetFloat64EquivSym(this->func);
        }
        else
        {
            Assert(UNREACHED);
        }

        IR::RegOpnd *newOpnd = IR::RegOpnd::New(stackSym, fromType, this->func);

        this->ToTypeSpecUse(nullptr, newOpnd, block, nullptr, nullptr, toType, bailOutKind, lossy, insertBeforeInstr);
    } NEXT_BITSET_IN_SPARSEBV;
}